

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dymon_srv.cpp
# Opt level: O3

void m_print_thread(void)

{
  cJSON *json;
  int iVar1;
  cJSON *in_RAX;
  cJSON *pcVar2;
  cJSON *arg;
  cJSON *labels;
  cJSON *local_28;
  
  local_28 = in_RAX;
  do {
    MessageQueue<cJSON_*,_32U>::pop(&m_LabelQueue,&local_28);
    json = local_28;
    pcVar2 = cJSON_GetObjectItemCaseSensitive(local_28,"ip");
    arg = (cJSON *)printJson->device;
    if ((cJSON *)printJson->device == (cJSON *)0x0) {
      arg = pcVar2;
    }
    iVar1 = Dymon::start(printJson->dymon,arg);
    if (iVar1 == 0) {
      PrintJson::print(printJson,json);
    }
    Dymon::end(printJson->dymon);
    cJSON_Delete(local_28);
  } while( true );
}

Assistant:

static void m_print_thread()
{
   cJSON * labels;

   while (true)
   {
      //get next print request out of the queue. wait until one become available
      m_LabelQueue.pop(labels);
      //print the labels
      m_print_labels(labels);
      //cleanup JSON
      cJSON_Delete(labels);
   }
}